

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void * __thiscall
PosixLockedPageAllocator::AllocateLocked
          (PosixLockedPageAllocator *this,size_t len,bool *lockingSuccess)

{
  long lVar1;
  int iVar2;
  size_t __len;
  size_t in_RDX;
  long in_FS_OFFSET;
  void *addr;
  size_t in_stack_ffffffffffffffd0;
  void *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __len = align_up(in_RDX,in_stack_ffffffffffffffd0);
  local_10 = mmap((void *)0x0,__len,3,0x22,-1,0);
  if (local_10 == (void *)0xffffffffffffffff) {
    local_10 = (void *)0x0;
  }
  else if (local_10 != (void *)0x0) {
    iVar2 = mlock(local_10,__len);
    *(bool *)in_RDX = iVar2 == 0;
    madvise(local_10,__len,0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

void *PosixLockedPageAllocator::AllocateLocked(size_t len, bool *lockingSuccess)
{
    void *addr;
    len = align_up(len, page_size);
    addr = mmap(nullptr, len, PROT_READ|PROT_WRITE, MAP_PRIVATE|MAP_ANONYMOUS, -1, 0);
    if (addr == MAP_FAILED) {
        return nullptr;
    }
    if (addr) {
        *lockingSuccess = mlock(addr, len) == 0;
#if defined(MADV_DONTDUMP) // Linux
        madvise(addr, len, MADV_DONTDUMP);
#elif defined(MADV_NOCORE) // FreeBSD
        madvise(addr, len, MADV_NOCORE);
#endif
    }
    return addr;
}